

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O2

void __thiscall Jzon::Node::append(Node *this,Node *node)

{
  Type TVar1;
  
  if (this->data != (Data *)0x0) {
    TVar1 = this->data->type;
    if (TVar1 == T_ARRAY) {
      if ((node->data != (Data *)0x0) && (node->data->type == T_ARRAY)) goto LAB_00192342;
    }
    else if ((TVar1 == T_OBJECT) && ((node->data != (Data *)0x0 && (node->data->type == T_OBJECT))))
    {
LAB_00192342:
      detach(this);
      std::
      vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
      ::
      insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,Jzon::Node>*,std::vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>>,void>
                ((vector<std::pair<std::__cxx11::string,Jzon::Node>,std::allocator<std::pair<std::__cxx11::string,Jzon::Node>>>
                  *)&this->data->children,
                 (this->data->children).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (node->data->children).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (node->data->children).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      return;
    }
  }
  return;
}

Assistant:

void Node::append(const Node &node)
	{
		if ((isObject() && node.isObject()) || (isArray() && node.isArray()))
		{
			detach();
			data->children.insert(data->children.end(), node.data->children.begin(), node.data->children.end());
		}
	}